

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O2

void __thiscall ncnn::PoolAllocator::PoolAllocator(PoolAllocator *this)

{
  PoolAllocatorPrivate *this_00;
  
  (this->super_Allocator)._vptr_Allocator = (_func_int **)&PTR__PoolAllocator_0052d458;
  this_00 = (PoolAllocatorPrivate *)operator_new(0x88);
  PoolAllocatorPrivate::PoolAllocatorPrivate(this_00);
  this->d = this_00;
  this_00->size_compare_ratio = 0xc0;
  return;
}

Assistant:

PoolAllocator::PoolAllocator()
    : Allocator(), d(new PoolAllocatorPrivate)
{
    d->size_compare_ratio = 192; // 0.75f * 256
}